

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureCache::QOpenGLTextureCache(QOpenGLTextureCache *this,QOpenGLContext *ctx)

{
  QOpenGLContextGroup *pQVar1;
  QCache<unsigned_long_long,_QOpenGLCachedTexture> *in_RDI;
  qsizetype in_stack_ffffffffffffffd8;
  
  pQVar1 = (QOpenGLContextGroup *)QOpenGLContext::shareGroup();
  QOpenGLSharedResource::QOpenGLSharedResource((QOpenGLSharedResource *)in_RDI,pQVar1);
  (in_RDI->chain).prev = (Chain *)&PTR__QOpenGLTextureCache_002141b8;
  QMutex::QMutex((QMutex *)0x19f57f);
  cacheSize();
  QCache<unsigned_long_long,_QOpenGLCachedTexture>::QCache(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

QOpenGLTextureCache::QOpenGLTextureCache(QOpenGLContext *ctx)
    : QOpenGLSharedResource(ctx->shareGroup())
    , m_cache(cacheSize())
{
}